

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9150::setLpf(RTIMUMPU9150 *this,uchar lpf)

{
  if (lpf < 7) {
    this->m_lpf = lpf;
  }
  else {
    setLpf((RTIMUMPU9150 *)(ulong)lpf);
  }
  return lpf < 7;
}

Assistant:

bool RTIMUMPU9150::setLpf(unsigned char lpf)
{
    switch (lpf) {
    case MPU9150_LPF_256:
    case MPU9150_LPF_188:
    case MPU9150_LPF_98:
    case MPU9150_LPF_42:
    case MPU9150_LPF_20:
    case MPU9150_LPF_10:
    case MPU9150_LPF_5:
        m_lpf = lpf;
        return true;

    default:
        HAL_ERROR1("Illegal MPU9150 lpf %d\n", lpf);
        return false;
    }
}